

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Args.cpp
# Opt level: O0

bool idx2::OptVal(int NArgs,cstr *Args,cstr Opt,u8 *Val)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  anon_union_8_2_2df48d06_for_stref_0 local_58;
  undefined4 local_50;
  int local_40;
  u8 auStack_3c [3];
  bool Success;
  int I;
  int IntVal;
  u8 *Val_local;
  cstr Opt_local;
  cstr *Args_local;
  int NArgs_local;
  anon_union_8_2_2df48d06_for_stref_0 *local_10;
  
  local_40 = 1;
  _I = Val;
  Val_local = (u8 *)Opt;
  Opt_local = (cstr)Args;
  Args_local._0_4_ = NArgs;
  while( true ) {
    if ((int)Args_local <= local_40 + 1) {
      return false;
    }
    iVar2 = strncmp(*(char **)(Opt_local + (long)local_40 * 8),(char *)Val_local,0x20);
    if (iVar2 == 0) break;
    local_40 = local_40 + 1;
  }
  _NArgs_local = (anon_union_8_2_2df48d06_for_stref_0)
                 ((anon_union_8_2_2df48d06_for_stref_0 *)(Opt_local + (long)(local_40 + 1) * 8))->
                 Ptr;
  local_10 = &local_58;
  local_58 = _NArgs_local;
  sVar3 = strlen(_NArgs_local);
  local_50 = (undefined4)sVar3;
  bVar1 = ToInt((stref *)&local_58,(int *)auStack_3c);
  *_I = auStack_3c[0];
  return bVar1;
}

Assistant:

bool
OptVal(int NArgs, cstr* Args, cstr Opt, u8* Val)
{
  int IntVal;
  for (int I = 1; I + 1 < NArgs; ++I)
  {
    if (strncmp(Args[I], Opt, 32) == 0)
    {
      bool Success = ToInt(Args[I + 1], &IntVal);
      *Val = (u8)IntVal;
      return Success;
    }
  }

  return false;
}